

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test::TestBody
          (Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test *this)

{
  void *pvVar1;
  pointer paVar2;
  bool bVar3;
  pointer paVar4;
  AssertHelper AStack_c8;
  Secp256k1 secp;
  ByteData actual;
  TweakPrivkeyTestVector test_vector;
  
  pvVar1 = (void *)wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&secp,pvVar1);
  paVar2 = tweak_privkey_error_vectors.
           super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar4 = tweak_privkey_error_vectors.
                super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
                _M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1) {
    anon_struct_112_4_5aca4469::TweakPrivkeyTestVector(&test_vector,paVar4);
    if (test_vector.expect_add._M_string_length == 0) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        cfd::core::Secp256k1::AddTweakPrivkeySecp256k1Ec(&actual,(ByteData *)&secp);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
      }
      testing::Message::Message((Message *)&actual);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x171,
                 "Expected: ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&actual);
      testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&actual);
      if (test_vector.expect_add._M_string_length == 0) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec(&actual,(ByteData *)&secp);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
        }
        testing::Message::Message((Message *)&actual);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x177,
                   "Expected: ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                  );
        testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&actual);
        testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&actual);
      }
    }
    anon_struct_112_4_5aca4469::~TweakPrivkeyTestVector(&test_vector);
  }
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
  }
}